

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stack.hpp
# Opt level: O1

void __thiscall
Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_>::Stack
          (Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_> *this,
          initializer_list<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_> cont)

{
  Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> *this_00;
  size_t initialCapacity;
  iterator pMVar1;
  iterator o;
  __mpz_struct local_60;
  __mpz_struct local_50;
  uint local_40;
  MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>_> *local_38;
  
  initialCapacity = cont._M_len;
  o = cont._M_array;
  Stack(this,initialCapacity);
  if (initialCapacity != 0) {
    pMVar1 = o + initialCapacity;
    do {
      Kernel::IntegerConstantType::IntegerConstantType
                ((IntegerConstantType *)&local_60,(IntegerConstantType *)o);
      Kernel::IntegerConstantType::IntegerConstantType
                ((IntegerConstantType *)&local_50,&(o->numeral)._den);
      local_40 = (o->factors)._id;
      local_38 = (o->factors)._ptr;
      if (this->_cursor == this->_end) {
        expand(this);
      }
      this_00 = this->_cursor;
      Kernel::IntegerConstantType::IntegerConstantType
                ((IntegerConstantType *)this_00,(IntegerConstantType *)&local_60);
      Kernel::IntegerConstantType::IntegerConstantType
                (&(this_00->numeral)._den,(IntegerConstantType *)&local_50);
      (this_00->factors)._id = local_40;
      (this_00->factors)._ptr = local_38;
      this->_cursor = this->_cursor + 1;
      mpz_clear(&local_50);
      mpz_clear(&local_60);
      o = o + 1;
    } while (o != pMVar1);
  }
  return;
}

Assistant:

Stack(std::initializer_list<C> cont)
   : Stack(cont.size())
  {
    for (auto const& x : cont) {
      push(x);
    }
  }